

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O0

uint64_t Hacl_Bignum64_eq_mask(uint32_t len,uint64_t *a,uint64_t *b)

{
  uint64_t uVar1;
  uint64_t mask1;
  uint64_t uu____0;
  ulong uStack_28;
  uint32_t i;
  uint64_t mask;
  uint64_t *b_local;
  uint64_t *a_local;
  uint32_t len_local;
  
  uStack_28 = 0xffffffffffffffff;
  for (uu____0._4_4_ = 0; uu____0._4_4_ < len; uu____0._4_4_ = uu____0._4_4_ + 1) {
    uVar1 = FStar_UInt64_eq_mask(a[uu____0._4_4_],b[uu____0._4_4_]);
    uStack_28 = uVar1 & uStack_28;
  }
  return uStack_28;
}

Assistant:

uint64_t Hacl_Bignum64_eq_mask(uint32_t len, uint64_t *a, uint64_t *b)
{
  uint64_t mask = 0xFFFFFFFFFFFFFFFFULL;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t uu____0 = FStar_UInt64_eq_mask(a[i], b[i]);
    mask = uu____0 & mask;
  }
  uint64_t mask1 = mask;
  return mask1;
}